

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O3

XMLError __thiscall
XMLParser::XMLNode::writeToFile(XMLNode *this,char *filename,char *encoding,char nFormat)

{
  char cVar1;
  XMLNodeData *pXVar2;
  long lVar3;
  int iVar4;
  FILE *__s;
  size_t sVar5;
  char *pcVar6;
  XMLNode *A;
  int i;
  XMLNode local_30;
  
  if (this->d == (XMLNodeData *)0x0) {
    return eXMLErrorNone;
  }
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    return eXMLErrorCannotOpenWriteFile;
  }
  pXVar2 = this->d;
  if ((pXVar2 == (XMLNodeData *)0x0) || (pXVar2->isDeclaration == '\0')) {
    if (pXVar2->lpszName == (char *)0x0) {
      if (pXVar2->nChild < 1) {
        A = (XMLNode *)&emptyXMLNode;
      }
      else {
        A = pXVar2->pChild;
      }
      XMLNode(&local_30,A);
      lVar3 = CONCAT44(local_30.d._4_4_,
                       CONCAT13(local_30.d._3_1_,CONCAT12(local_30.d._2_1_,local_30.d._0_2_)));
      if (lVar3 == 0) {
        ~XMLNode(&local_30);
      }
      else {
        cVar1 = *(char *)(lVar3 + 0x18);
        ~XMLNode(&local_30);
        if (cVar1 != '\0') goto LAB_00197628;
      }
    }
    if (characterEncoding == 3) {
      encoding = "SHIFT-JIS";
    }
    else if (characterEncoding == 1) {
      local_30.d._2_1_ = 0xbf;
      local_30.d._0_2_ = 0xbbef;
      sVar5 = fwrite(&local_30,3,1,__s);
      if (sVar5 == 0) goto LAB_0019774c;
      encoding = "utf-8";
    }
    pcVar6 = "ISO-8859-1";
    if (encoding != (char *)0x0) {
      pcVar6 = encoding;
    }
    iVar4 = fprintf(__s,"<?xml version=\"1.0\" encoding=\"%s\"?>\n",pcVar6);
    if (iVar4 < 0) goto LAB_0019774c;
  }
  else {
LAB_00197628:
    if (characterEncoding == 1) {
      local_30.d._2_1_ = 0xbf;
      local_30.d._0_2_ = 0xbbef;
      sVar5 = fwrite(&local_30,3,1,__s);
      if (sVar5 == 0) goto LAB_0019774c;
    }
  }
  pcVar6 = createXMLString(this,(int)nFormat,(int *)&local_30);
  sVar5 = fwrite(pcVar6,(long)CONCAT13(local_30.d._3_1_,CONCAT12(local_30.d._2_1_,local_30.d._0_2_))
                 ,1,__s);
  if (sVar5 != 0) {
    iVar4 = fclose(__s);
    free(pcVar6);
    return (uint)(iVar4 != 0) << 4;
  }
  free(pcVar6);
LAB_0019774c:
  fclose(__s);
  return eXMLErrorCannotWriteFile;
}

Assistant:

XMLError XMLNode::writeToFile(XMLCSTR filename, const char * encoding, char nFormat) const
    {
        if(!d)
            return eXMLErrorNone;
        FILE * f = xfopen(filename, _CXML("wb"));
        if(!f)
            return eXMLErrorCannotOpenWriteFile;
#ifdef _XMLWIDECHAR
        unsigned char h[2] = {0xFF, 0xFE};
        if(!fwrite(h, 2, 1, f))
        {
            fclose(f);
            return eXMLErrorCannotWriteFile;
        }
        if((!isDeclaration()) && ((d->lpszName) || (!getChildNode().isDeclaration())))
        {
            if(!fwrite(
                 L"<?xml version=\"1.0\" encoding=\"utf-16\"?>\n", sizeof(wchar_t) * 40, 1, f))
            {
                fclose(f);
                return eXMLErrorCannotWriteFile;
            }
        }
#else
        if((!isDeclaration()) && ((d->lpszName) || (!getChildNode().isDeclaration())))
        {
            if(characterEncoding == char_encoding_UTF8)
            {
                // header so that windows recognize the file as UTF-8:
                unsigned char h[3] = {0xEF, 0xBB, 0xBF};
                if(!fwrite(h, 3, 1, f))
                {
                    fclose(f);
                    return eXMLErrorCannotWriteFile;
                }
                encoding = "utf-8";
            }
            else if(characterEncoding == char_encoding_ShiftJIS)
                encoding = "SHIFT-JIS";

            if(!encoding)
                encoding = "ISO-8859-1";
            if(fprintf(f, "<?xml version=\"1.0\" encoding=\"%s\"?>\n", encoding) < 0)
            {
                fclose(f);
                return eXMLErrorCannotWriteFile;
            }
        }
        else
        {
            if(characterEncoding == char_encoding_UTF8)
            {
                unsigned char h[3] = {0xEF, 0xBB, 0xBF};
                if(!fwrite(h, 3, 1, f))
                {
                    fclose(f);
                    return eXMLErrorCannotWriteFile;
                }
            }
        }
#endif
        int i;
        XMLSTR t = createXMLString(nFormat, &i);
        if(!fwrite(t, sizeof(XMLCHAR) * i, 1, f))
        {
            free(t);
            fclose(f);
            return eXMLErrorCannotWriteFile;
        }
        if(fclose(f) != 0)
        {
            free(t);
            return eXMLErrorCannotWriteFile;
        }
        free(t);
        return eXMLErrorNone;
    }